

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easm.c
# Opt level: O0

void easm_del_operand(easm_operand *operand)

{
  int local_14;
  int i;
  easm_operand *operand_local;
  
  if (operand != (easm_operand *)0x0) {
    easm_del_mods(operand->mods);
    for (local_14 = 0; local_14 < operand->exprsnum; local_14 = local_14 + 1) {
      easm_del_expr(operand->exprs[local_14]);
    }
    free(operand->exprs);
    free(operand);
  }
  return;
}

Assistant:

void easm_del_operand(struct easm_operand *operand) {
	if (!operand) return;
	easm_del_mods(operand->mods);
	int i;
	for (i = 0; i < operand->exprsnum; i++)
		easm_del_expr(operand->exprs[i]);
	free(operand->exprs);
	free(operand);
}